

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RootPageMoved(sqlite3 *db,int iDb,Pgno iFrom,Pgno iTo)

{
  Db *pDVar1;
  Index *pIdx;
  Table *pTab;
  Db *pDb;
  Hash *pHash;
  HashElem *pElem;
  Pgno iTo_local;
  Pgno iFrom_local;
  int iDb_local;
  sqlite3 *db_local;
  
  pDVar1 = db->aDb;
  for (pHash = (Hash *)((pDVar1[iDb].pSchema)->tblHash).first; pHash != (Hash *)0x0;
      pHash = *(Hash **)pHash) {
    if (*(Pgno *)&pHash->ht[2].chain == iFrom) {
      *(Pgno *)&pHash->ht[2].chain = iTo;
    }
  }
  for (pHash = (Hash *)((pDVar1[iDb].pSchema)->idxHash).first; pHash != (Hash *)0x0;
      pHash = *(Hash **)pHash) {
    if (*(Pgno *)&pHash->ht[5].chain == iFrom) {
      *(Pgno *)&pHash->ht[5].chain = iTo;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RootPageMoved(sqlite3 *db, int iDb, Pgno iFrom, Pgno iTo){
  HashElem *pElem;
  Hash *pHash;
  Db *pDb;

  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  pDb = &db->aDb[iDb];
  pHash = &pDb->pSchema->tblHash;
  for(pElem=sqliteHashFirst(pHash); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    if( pTab->tnum==iFrom ){
      pTab->tnum = iTo;
    }
  }
  pHash = &pDb->pSchema->idxHash;
  for(pElem=sqliteHashFirst(pHash); pElem; pElem=sqliteHashNext(pElem)){
    Index *pIdx = sqliteHashData(pElem);
    if( pIdx->tnum==iFrom ){
      pIdx->tnum = iTo;
    }
  }
}